

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O1

EStatusCode __thiscall
CFFPrimitiveReader::ReadRealOperand
          (CFFPrimitiveReader *this,double *outValue,long *outRealValueFractalEnd)

{
  byte bVar1;
  bool bVar2;
  byte in_AL;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  EStatusCode EVar8;
  int i;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  undefined8 uVar13;
  Byte buffer;
  Byte nibble [2];
  byte local_8b;
  byte local_8a [2];
  double local_88;
  double *local_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  ulong local_58;
  ulong local_50;
  double local_48;
  undefined8 uStack_40;
  
  *outRealValueFractalEnd = 0;
  local_88 = 1.0;
  bVar6 = true;
  local_68 = 0.0;
  uStack_60 = 0;
  bVar7 = false;
  local_78 = 0.0;
  uStack_70 = 0;
  dVar12 = 0.0;
  uVar13 = 0;
  uVar10 = 0;
  bVar2 = false;
  uVar5 = 0;
  local_80 = outValue;
  do {
    if (this->mInternalState == eFailure) {
      EVar8 = eFailure;
    }
    else {
      local_58 = uVar10;
      local_50 = uVar5;
      local_48 = dVar12;
      uStack_40 = uVar13;
      iVar3 = (*(this->mCFFFile->super_IByteReader)._vptr_IByteReader[2])
                        (this->mCFFFile,&local_8b,1);
      bVar11 = CONCAT44(extraout_var,iVar3) != 1;
      if (bVar11) {
        this->mInternalState = eFailure;
      }
      EVar8 = -(uint)bVar11;
      uVar5 = local_50;
      uVar10 = local_58;
      dVar12 = local_48;
      uVar13 = uStack_40;
      in_AL = local_8b;
    }
    if (EVar8 != eSuccess) break;
    local_8a[0] = in_AL >> 4;
    local_8a[1] = in_AL & 0xf;
    lVar4 = *outRealValueFractalEnd;
    lVar9 = 0;
    do {
      bVar1 = local_8a[lVar9];
      switch(bVar1) {
      case 10:
        uVar10 = CONCAT71((int7)(uVar10 >> 8),1);
        break;
      case 0xb:
        bVar2 = true;
        break;
      case 0xc:
        uVar5 = CONCAT71((int7)(uVar5 >> 8),1);
        break;
      case 0xd:
        break;
      case 0xe:
        bVar7 = true;
        break;
      case 0xf:
        bVar6 = false;
        break;
      default:
        if ((bVar2) || ((uVar5 & 1) != 0)) {
          dVar12 = dVar12 * 10.0 + (double)bVar1;
        }
        else if ((uVar10 & 1) == 0) {
          local_68 = local_68 * 10.0 + (double)bVar1;
        }
        else {
          local_78 = local_78 * 10.0 + (double)bVar1;
          local_88 = local_88 * 10.0;
          lVar4 = lVar4 + 1;
          *outRealValueFractalEnd = lVar4;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 == 1);
  } while (bVar6);
  if (EVar8 == eSuccess) {
    local_68 = local_68 + local_78 / local_88;
    if (((uVar5 & 1) != 0) || (bVar2)) {
      if ((uVar5 & 1) != 0) {
        dVar12 = -dVar12;
      }
      dVar12 = pow(10.0,dVar12);
      local_68 = local_68 * dVar12;
    }
    if (bVar7) {
      local_68 = -local_68;
    }
    *local_80 = local_68;
  }
  return EVar8;
}

Assistant:

EStatusCode CFFPrimitiveReader::ReadRealOperand(double& outValue,long& outRealValueFractalEnd)
{
	double integerPart = 0;
	double fractionPart = 0;
	double powerPart = 0;
	double result;
	bool hasNegative = false;
	bool hasFraction = false;
	bool hasPositivePower = false;
	bool hasNegativePower = false;
	bool notDone = true;
	double fractionDecimal = 1;
	outRealValueFractalEnd = 0;
	Byte buffer;
	Byte nibble[2];
	EStatusCode status = PDFHummus::eSuccess;

	do
	{
		status = ReadByte(buffer);
		if(status != PDFHummus::eSuccess)
			break;

		nibble[0] = (buffer >> 4) & 0xf;
		nibble[1] = buffer & 0xf;

		for(int i = 0; i <2; ++i)
		{
			switch(nibble[i])
			{
				case 0xa:
					hasFraction = true;
					break;
				case 0xb:
					hasPositivePower = true;
					break;
				case 0xc:
					hasNegativePower = true;
					break;
				case 0xd:
					// reserved
					break;
				case 0xe:
					hasNegative = true;
					break;
				case 0xf:
					notDone = false;
					break;
				default: // numbers
					if(hasPositivePower || hasNegativePower)
					{
						powerPart = powerPart*10 + nibble[i];
					}
					else if(hasFraction)
					{
						fractionPart = fractionPart * 10 + nibble[i];
						fractionDecimal *= 10;
						++outRealValueFractalEnd;
					}
					else
						integerPart = integerPart * 10 + nibble[i];

			}
		}
	}while(notDone);

	if(PDFHummus::eSuccess == status)
	{
		result = integerPart + fractionPart/fractionDecimal;
		if(hasNegativePower || hasPositivePower)
			result = result * pow(10,hasNegativePower ? -powerPart : powerPart);
		if(hasNegative)
			result = -1*result;
		outValue = result;
	}
	return status;
}